

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_eval.cpp
# Opt level: O0

void __thiscall
ON_SubDComponentParameter::ON_SubDComponentParameter
          (ON_SubDComponentParameter *this,ON_SubDEdge *e,double edge_s,ON_SubDFace *active_face)

{
  bool bVar1;
  ON_SubDFacePtr fptr;
  anon_union_8_3_6bf0bb0e_for_m_p0 local_68;
  anon_union_8_3_7b68a318_for_m_p1 local_3c;
  uint local_34;
  ON_SubDComponentId OStack_30;
  uint efi;
  ON_SubDFace *local_28;
  ON_SubDFace *active_face_local;
  double edge_s_local;
  ON_SubDEdge *e_local;
  ON_SubDComponentParameter *this_local;
  
  this->m_cid = ON_SubDComponentId::Unset;
  local_28 = active_face;
  active_face_local = (ON_SubDFace *)edge_s;
  edge_s_local = (double)e;
  e_local = (ON_SubDEdge *)this;
  memset(&this->m_p0,0,8);
  ON_SubDComponentId::ON_SubDComponentId(&(this->m_p0).v_active_e);
  memset(&this->m_p1,0,8);
  ON_SubDComponentId::ON_SubDComponentId(&(this->m_p1).v_active_f);
  ON_SubDComponentId::ON_SubDComponentId(&stack0xffffffffffffffd0,(ON_SubDEdge *)edge_s_local);
  bVar1 = Internal_Init(this,OStack_30);
  if (bVar1) {
    if (((double)active_face_local < 0.0) || (1.0 < (double)active_face_local)) {
      local_68.eptr_s = ON_DBL_QNAN;
    }
    else {
      local_68 = (anon_union_8_3_6bf0bb0e_for_m_p0)active_face_local;
    }
    this->m_p0 = local_68;
    if (local_28 != (ON_SubDFace *)0x0) {
      local_34 = ON_SubDEdge::FaceArrayIndex((ON_SubDEdge *)edge_s_local,local_28);
      fptr = ON_SubDEdge::FacePtr((ON_SubDEdge *)edge_s_local,local_34);
      ON_SubDComponentId::ON_SubDComponentId(&local_3c.v_active_f,fptr);
      this->m_p1 = local_3c;
    }
  }
  return;
}

Assistant:

ON_SubDComponentParameter::ON_SubDComponentParameter(
  const ON_SubDEdge* e,
  double edge_s,
  const class ON_SubDFace* active_face
)
{
  if (Internal_Init(ON_SubDComponentId(e)))
  {
    m_p0.eptr_s = (edge_s >= 0.0 && edge_s <= 1.0) ? edge_s : ON_DBL_QNAN;
    if (nullptr != active_face)
    {
      const unsigned efi = e->FaceArrayIndex(active_face);
      m_p1.e_active_f = e->FacePtr(efi);
    }
  }
}